

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db.c
# Opt level: O0

void append_file(CHAR_DATA *ch,char *file,char *str)

{
  ulong uVar1;
  FILE *__stream;
  int *piVar2;
  char *__src;
  char *in_RDX;
  char *in_RSI;
  char_data *in_RDI;
  char buf [4608];
  FILE *fp;
  uint local_1254;
  char *in_stack_ffffffffffffedb8;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffedc0;
  char **in_stack_ffffffffffffedd8;
  char **in_stack_ffffffffffffede0;
  CLogger *in_stack_ffffffffffffede8;
  string_view in_stack_ffffffffffffedf0;
  
  uVar1 = is_npc(in_RDI);
  if (((uVar1 & 1) == 0) && (*in_RDX != '\0')) {
    fclose(_fpReserve);
    __stream = fopen(in_RSI,"a");
    if (__stream == (FILE *)0x0) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (in_stack_ffffffffffffedc0,in_stack_ffffffffffffedb8);
      piVar2 = __errno_location();
      strerror(*piVar2);
      CLogger::Warn<char*&,char*>
                (in_stack_ffffffffffffede8,in_stack_ffffffffffffedf0,in_stack_ffffffffffffede0,
                 in_stack_ffffffffffffedd8);
      send_to_char("Could not open the file!\n\r",in_RDI);
    }
    else {
      __src = ctime((time_t *)&current_time);
      strcpy(&stack0xffffffffffffedd8,__src);
      chop(&stack0xffffffffffffedd8);
      if (in_RDI->in_room == (ROOM_INDEX_DATA *)0x0) {
        local_1254 = 0;
      }
      else {
        local_1254 = (uint)in_RDI->in_room->vnum;
      }
      fprintf(__stream,"[%5d] %s: %s: %s\n",(ulong)local_1254,in_RDI->true_name,
              &stack0xffffffffffffedd8,in_RDX);
      fclose(__stream);
    }
    _fpReserve = fopen("/dev/null","r");
  }
  return;
}

Assistant:

void append_file(CHAR_DATA *ch, char *file, char *str)
{
	FILE *fp;
	char buf[MSL];

	if (is_npc(ch) || str[0] == '\0')
		return;

	fclose(fpReserve);

	fp = fopen(file, "a");

	if (fp == nullptr)
	{
		RS.Logger.Warn("Append_file: fopen {}: {}", file, std::strerror(errno));
		send_to_char("Could not open the file!\n\r", ch);
	}
	else
	{
		// free_pstring(buf);
		strcpy(buf, ctime(&current_time));
		chop(buf);
		fprintf(fp, "[%5d] %s: %s: %s\n", ch->in_room ? ch->in_room->vnum : 0, ch->true_name, buf, str);
		fclose(fp);
	}

	fpReserve = fopen(NULL_FILE, "r");
}